

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.h
# Opt level: O0

void __thiscall gnilk::IPCTestResults::IPCTestResults(IPCTestResults *this,Ref *useTestResult)

{
  Ref *useTestResult_local;
  IPCTestResults *this_local;
  
  IPCSerializer::IPCSerializer(&this->super_IPCSerializer);
  IPCDeserializer::IPCDeserializer(&this->super_IPCDeserializer);
  (this->super_IPCSerializer)._vptr_IPCSerializer = (_func_int **)&PTR__IPCTestResults_003c7ec0;
  (this->super_IPCDeserializer).super_IPCObject._vptr_IPCObject =
       (_func_int **)&PTR__IPCTestResults_003c7ef8;
  std::__cxx11::string::string((string *)&this->symbolName);
  std::shared_ptr<trun::TestResult>::shared_ptr(&this->testResult,useTestResult);
  trun::AssertError::AssertError(&this->assertError);
  return;
}

Assistant:

IPCTestResults(const trun::TestResult::Ref &useTestResult) : testResult(useTestResult) {}